

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

bool __thiscall EthUdpPort::SetMulticastIP(EthUdpPort *this,string *multicast)

{
  bool bVar1;
  
  if ((this->sockPtr != (SocketInternals *)0x0) &&
     (bVar1 = SocketInternals::SetMulticastIP(this->sockPtr,multicast), bVar1)) {
    std::__cxx11::string::_M_assign((string *)&this->MulticastIP);
    return true;
  }
  return false;
}

Assistant:

bool EthUdpPort::SetMulticastIP(const std::string &multicast)
{
    if (!sockPtr)
        return false;
    bool ret = sockPtr->SetMulticastIP(multicast);
    if (ret)
        MulticastIP = multicast;
    return ret;
}